

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
insert<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table,size_t pos,
          StringPtr *params)

{
  size_t *psVar1;
  uint uVar2;
  RawBrandedSchema *pRVar3;
  size_t sVar4;
  void *__s2;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar11;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar12;
  size_t sVar13;
  Entry *this_00;
  ulong targetSize;
  uint hash;
  undefined8 *in_R9;
  HashBucket *s;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar14;
  Maybe<unsigned_long> MVar15;
  ArrayPtr<const_unsigned_char> s_00;
  
  this_00 = table.ptr;
  uVar6 = *(size_t *)&(this_00->value).index * 2;
  if (uVar6 < ((this_00->key).content.size_ + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar6) {
      targetSize = uVar6;
    }
    HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>::rehash
              ((HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks> *)
               this_00,targetSize);
  }
  s_00.size_ = in_R9[1] - 1;
  s_00.ptr = (uchar *)*in_R9;
  uVar7 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s_00);
  aVar12.value._1_7_ = 0;
  aVar12.value._0_1_ = uVar7 != 0;
  hash = CONCAT31(0,uVar7 != 0);
  uVar8 = kj::_::chooseBucket(hash,(uint)*(size_t *)&(this_00->value).index);
  pRVar3 = (this_00->value).parent.super_Schema.raw;
  sVar4 = *(size_t *)&(this_00->value).index;
  __s2 = (void *)*in_R9;
  lVar5 = in_R9[1];
  paVar14 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  do {
    paVar11 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              (&pRVar3->generic + uVar8);
    uVar2 = *(uint *)((long)paVar11 + 4);
    if (uVar2 == 1) {
      if (paVar14 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar14 = paVar11;
      }
    }
    else {
      if (uVar2 == 0) {
        if (paVar14 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          psVar1 = &(this_00->key).content.size_;
          *psVar1 = *psVar1 - 1;
          paVar11 = paVar14;
        }
        aVar12.value = ((ulong)(uVar7 != 0) | (long)params << 0x20) + 0x200000000;
        paVar11->value = (unsigned_long)aVar12;
        *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x0;
        goto LAB_0039438b;
      }
      if (*(uint *)paVar11 == (uint)aVar12.value) {
        lVar10 = (ulong)(uVar2 - 2) * 0x50;
        if (*(long *)(table.size_ + 8 + lVar10) == lVar5) {
          iVar9 = bcmp(*(void **)(lVar10 + table.size_),__s2,lVar5 - 1);
          aVar12.value._4_4_ = 0;
          aVar12.value._0_4_ = hash;
          if (iVar9 == 0) {
            *this = (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x1
            ;
            *(ulong *)(this + 8) = (ulong)(uVar2 - 2);
LAB_0039438b:
            MVar15.ptr.field_1.value = aVar12.value;
            MVar15.ptr._0_8_ = this;
            return (Maybe<unsigned_long>)MVar15.ptr;
          }
        }
      }
    }
    sVar13 = (ulong)uVar8 + 1;
    uVar8 = (uint)sVar13;
    if (sVar13 == sVar4) {
      uVar8 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }